

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

bool ungroup_selective_undo_allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object selection_widget;
  Am_Object group;
  Am_Value value;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Value local_38;
  Am_Object local_28;
  Am_Value local_20;
  
  local_48.data = (Am_Object_Data *)0x0;
  local_50.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_28,command_obj);
  Am_Get_Selection_Widget_For_Command((Am_Object *)&local_38);
  Am_Object::operator=(&local_50,(Am_Object *)&local_38);
  Am_Object::~Am_Object((Am_Object *)&local_38);
  Am_Object::~Am_Object(&local_28);
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::Valid(&local_50);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_50,0x193,0);
    Am_Object::operator=(&local_48,pAVar2);
    pAVar2 = Am_Object::Get(command_obj,0x169,1);
    Am_Value::operator=(&local_38,pAVar2);
    Am_Value::Am_Value(&local_20,&local_38);
    Am_Object::Am_Object(&local_40,&local_48);
    bVar1 = check_all_vis_and_in_group(&local_20,&local_40,false);
    Am_Object::~Am_Object(&local_40);
    Am_Value::~Am_Value(&local_20);
  }
  else {
    bVar1 = false;
  }
  Am_Value::~Am_Value(&local_38);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_48);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 ungroup_selective_undo_allowed, (Am_Object command_obj))
{
  Am_Object group, selection_widget;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  Am_Value value;
  if (selection_widget.Valid()) {
    group = selection_widget.Get(Am_OPERATES_ON);
    value = command_obj.Peek(Am_VALUE); //all the objects in all sub-groups
    return check_all_vis_and_in_group(value, group, false);
  } else
    return false;
}